

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

bool is_date(uint32_t year,Month month,uint32_t day)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  
  if ((day != 0) && (((day < 0x1f || (nov < month)) || ((0xa50U >> ((byte)month & 0x1f) & 1) == 0)))
     ) {
    if ((day < 0x20) || (month < dec && (0x5abU >> ((byte)month & 0x1f) & 1) == 0)) {
      bVar1 = 1;
      if (month != feb) goto LAB_00112bff;
      if ((year & 3) == 0) {
        uVar2 = year * -0x3d70a3d7 + 0x51eb850;
        bVar3 = true;
        if ((uVar2 >> 2 | year * 0x40000000) < 0x28f5c29) {
          bVar3 = (uVar2 >> 4 | year * -0x70000000) < 0xa3d70b;
        }
      }
      else {
        bVar3 = false;
      }
      if ((day < 0x1e) || (!bVar3)) {
        if ((year & 3) == 0) {
          uVar2 = year * -0x3d70a3d7 + 0x51eb850;
          bVar3 = true;
          if ((uVar2 >> 2 | year * 0x40000000) < 0x28f5c29) {
            bVar3 = (uVar2 >> 4 | year * -0x70000000) < 0xa3d70b;
          }
        }
        else {
          bVar3 = false;
        }
        bVar1 = day < 0x1d | bVar3;
        goto LAB_00112bff;
      }
    }
  }
  bVar1 = 0;
LAB_00112bff:
  return (bool)(0x7b1 < year & bVar1);
}

Assistant:

bool is_date(uint32_t year, Month month, uint32_t day)
{
	bool is_valid = year >= 1970;
	bool is_bad_day = day == 0 ||
		(
			(is_30_day_month(month) && day > 30) ||
			(is_31_day_month(month) && day > 31) ||
			(month == Month::feb && 
				((leapyear(year) && day > 29) || (!leapyear(year) && day > 28)))
			);
	is_valid = is_valid && !is_bad_day;
	return is_valid;
}